

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_infix(FuncState *fs,BinOpr op,expdesc *v)

{
  int iVar1;
  int local_28;
  int local_24;
  int dummy2;
  int dummy;
  expdesc *v_local;
  FuncState *pFStack_10;
  BinOpr op_local;
  FuncState *fs_local;
  
  _dummy2 = v;
  v_local._4_4_ = op;
  pFStack_10 = fs;
  luaK_dischargevars(fs,v);
  switch(v_local._4_4_) {
  case OPR_ADD:
  case OPR_SUB:
  case OPR_MUL:
  case OPR_MOD:
  case OPR_POW:
  case OPR_DIV:
  case OPR_IDIV:
  case OPR_BAND:
  case OPR_BOR:
  case OPR_BXOR:
  case OPR_SHL:
  case OPR_SHR:
    iVar1 = tonumeral(_dummy2,(TValue *)0x0);
    if (iVar1 == 0) {
      luaK_exp2anyreg(pFStack_10,_dummy2);
    }
    break;
  case OPR_CONCAT:
    luaK_exp2nextreg(pFStack_10,_dummy2);
    break;
  case OPR_EQ:
  case OPR_NE:
    iVar1 = tonumeral(_dummy2,(TValue *)0x0);
    if (iVar1 == 0) {
      exp2RK(pFStack_10,_dummy2);
    }
    break;
  case OPR_LT:
  case OPR_LE:
  case OPR_GT:
  case OPR_GE:
    iVar1 = isSCnumber(_dummy2,&local_24,&local_28);
    if (iVar1 == 0) {
      luaK_exp2anyreg(pFStack_10,_dummy2);
    }
    break;
  case OPR_AND:
    luaK_goiftrue(pFStack_10,_dummy2);
    break;
  case OPR_OR:
    luaK_goiffalse(pFStack_10,_dummy2);
  }
  return;
}

Assistant:

void luaK_infix (FuncState *fs, BinOpr op, expdesc *v) {
  luaK_dischargevars(fs, v);
  switch (op) {
    case OPR_AND: {
      luaK_goiftrue(fs, v);  /* go ahead only if 'v' is true */
      break;
    }
    case OPR_OR: {
      luaK_goiffalse(fs, v);  /* go ahead only if 'v' is false */
      break;
    }
    case OPR_CONCAT: {
      luaK_exp2nextreg(fs, v);  /* operand must be on the stack */
      break;
    }
    case OPR_ADD: case OPR_SUB:
    case OPR_MUL: case OPR_DIV: case OPR_IDIV:
    case OPR_MOD: case OPR_POW:
    case OPR_BAND: case OPR_BOR: case OPR_BXOR:
    case OPR_SHL: case OPR_SHR: {
      if (!tonumeral(v, NULL))
        luaK_exp2anyreg(fs, v);
      /* else keep numeral, which may be folded or used as an immediate
         operand */
      break;
    }
    case OPR_EQ: case OPR_NE: {
      if (!tonumeral(v, NULL))
        exp2RK(fs, v);
      /* else keep numeral, which may be an immediate operand */
      break;
    }
    case OPR_LT: case OPR_LE:
    case OPR_GT: case OPR_GE: {
      int dummy, dummy2;
      if (!isSCnumber(v, &dummy, &dummy2))
        luaK_exp2anyreg(fs, v);
      /* else keep numeral, which may be an immediate operand */
      break;
    }
    default: lua_assert(0);
  }
}